

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

WeakArenaReference<Js::IDiagObjectModelWalkerBase> * __thiscall
Js::RecyclableArgumentsObjectDisplay::CreateWalker(RecyclableArgumentsObjectDisplay *this)

{
  ThreadContext *this_00;
  DebugManager *this_01;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  RecyclableArgumentsObjectWalker *this_02;
  HeapAllocator *alloc;
  RecyclableArgumentsObjectDisplay *this_03;
  TrackAllocData local_88;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  RecyclableArgumentsObjectWalker *local_28;
  IDiagObjectModelWalkerBase *pOMWalker;
  ReferencedArenaAdapter *pRefArena;
  RecyclableArgumentsObjectDisplay *this_local;
  
  pRefArena = (ReferencedArenaAdapter *)this;
  this_00 = ScriptContext::GetThreadContext((this->super_RecyclableObjectDisplay).scriptContext);
  this_01 = ThreadContext::GetDebugManager(this_00);
  pOMWalker = (IDiagObjectModelWalkerBase *)DebugManager::GetDiagnosticArena(this_01);
  if ((ReferencedArenaAdapter *)pOMWalker == (ReferencedArenaAdapter *)0x0) {
    this_local = (RecyclableArgumentsObjectDisplay *)0x0;
  }
  else {
    pAVar1 = &Memory::ReferencedArenaAdapter::Arena((ReferencedArenaAdapter *)pOMWalker)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&RecyclableArgumentsObjectWalker::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xbef);
    pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar1,&local_50);
    local_60 = Memory::ArenaAllocator::Alloc;
    local_58 = 0;
    this_02 = (RecyclableArgumentsObjectWalker *)
              new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar1,0x3f67b0);
    RecyclableArgumentsObjectWalker::RecyclableArgumentsObjectWalker
              (this_02,(this->super_RecyclableObjectDisplay).scriptContext,
               (this->super_RecyclableObjectDisplay).instance,this->pLocalsWalker);
    local_28 = this_02;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,
               (type_info *)&Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xbf0);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_88);
    this_03 = (RecyclableArgumentsObjectDisplay *)new<Memory::HeapAllocator>(0x10,alloc,0x350bd0);
    Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::WeakArenaReference
              ((WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)this_03,
               (ReferencedArenaAdapter *)pOMWalker,(IDiagObjectModelWalkerBase *)local_28);
    this_local = this_03;
  }
  return (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)this_local;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* RecyclableArgumentsObjectDisplay::CreateWalker()
    {
        ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
        if (pRefArena)
        {
            IDiagObjectModelWalkerBase* pOMWalker = Anew(pRefArena->Arena(), RecyclableArgumentsObjectWalker, scriptContext, instance, pLocalsWalker);
            return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>,pRefArena, pOMWalker);
        }
        return nullptr;
    }